

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

CommandLineFlag * __thiscall
google::anon_unknown_1::FlagRegistry::FindFlagLocked(FlagRegistry *this,char *name)

{
  _Base_ptr p_Var1;
  uint uVar2;
  int iVar3;
  _Base_ptr *pp_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  
  p_Var5 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header;
  pp_Var4 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var5->_M_header;
  while (p_Var1 = *pp_Var4, p_Var1 != (_Base_ptr)0x0) {
    uVar2 = strcmp(*(char **)(p_Var1 + 1),name);
    if (-1 < (int)uVar2) {
      p_Var6 = p_Var1;
    }
    pp_Var4 = &p_Var1->_M_left + (uVar2 >> 0x1f);
  }
  if (((_Rb_tree_header *)p_Var6 != p_Var5) &&
     (iVar3 = strcmp(name,*(char **)(p_Var6 + 1)), -1 < iVar3)) {
    return (CommandLineFlag *)p_Var6[1]._M_parent;
  }
  return (CommandLineFlag *)0x0;
}

Assistant:

CommandLineFlag* FlagRegistry::FindFlagLocked(const char* name) {
  FlagConstIterator i = flags_.find(name);
  if (i == flags_.end()) {
    return NULL;
  } else {
    return i->second;
  }
}